

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuron.cpp
# Opt level: O1

void __thiscall
indk::Neuron::setEntries
          (Neuron *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *inputs)

{
  pointer ppVar1;
  pointer pbVar2;
  Entry *pEVar3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
  *__range1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>
  *e;
  pointer ppVar4;
  pointer __args;
  Entry *E;
  Entry *local_30;
  
  ppVar1 = (this->Entries).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar4 = (this->Entries).
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron::Entry_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar4 != ppVar1; ppVar4 = ppVar4 + 1) {
    pEVar3 = ppVar4->second;
    if (pEVar3 != (Entry *)0x0) {
      Entry::~Entry(pEVar3);
      operator_delete(pEVar3,0x40);
    }
  }
  __args = (inputs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar2 = (inputs->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (__args != pbVar2) {
    do {
      pEVar3 = (Entry *)operator_new(0x40);
      Entry::Entry(pEVar3);
      local_30 = pEVar3;
      std::
      vector<std::pair<std::__cxx11::string,indk::Neuron::Entry*>,std::allocator<std::pair<std::__cxx11::string,indk::Neuron::Entry*>>>
      ::emplace_back<std::__cxx11::string_const&,indk::Neuron::Entry*&>
                ((vector<std::pair<std::__cxx11::string,indk::Neuron::Entry*>,std::allocator<std::pair<std::__cxx11::string,indk::Neuron::Entry*>>>
                  *)this,__args,&local_30);
      __args = __args + 1;
    } while (__args != pbVar2);
  }
  return;
}

Assistant:

void indk::Neuron::setEntries(const std::vector<std::string>& inputs) {
    for (const auto& e: Entries)
        delete e.second;

    for (const auto &i: inputs) {
        auto *E = new Entry();
        Entries.emplace_back(i, E);
    }
}